

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

SourceBuffer * __thiscall
slang::SourceManager::cacheBuffer
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,path *path,string *pathStr,
          SourceLocation includedFrom,SourceLibrary *library,uint64_t sortKey,
          SmallVector<char,_40UL> *buffer)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  flat_hash_map<std::string,_std::pair<std::unique_ptr<FileData>,_std::error_code>_> *this_00;
  size_type sVar5;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var6;
  value_type_pointer ppVar7;
  pointer __s1;
  size_t __n;
  uint uVar8;
  byte bVar9;
  SourceManager *pSVar10;
  string *psVar11;
  SourceBuffer *pSVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  uint64_t hash;
  path *__p;
  ulong uVar16;
  size_t sVar17;
  ulong pos0;
  ulong uVar18;
  ulong uVar19;
  undefined8 uVar20;
  value_type_pointer ppVar21;
  group_type_pointer pgVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  byte bVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  byte bVar40;
  pair<std::_Rb_tree_iterator<std::filesystem::__cxx11::path>,_bool> pVar41;
  string name;
  unique_lock<std::shared_mutex> lock;
  locator res;
  string *in_stack_fffffffffffffe98;
  try_emplace_args_t local_149;
  SourceManager *local_148;
  FileData *local_140;
  path *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string *local_110;
  unique_lock<std::shared_mutex> local_108;
  path local_f8;
  path local_d0;
  ulong local_a8;
  ulong local_a0;
  size_t local_98;
  ulong local_90;
  value_type_pointer local_88;
  ulong local_80;
  group_type_pointer local_78;
  SourceLocation local_70;
  SourceLibrary *local_68;
  SourceBuffer *local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  paVar3 = &local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_148 = this;
  local_130._M_dataplus._M_p = (pointer)paVar3;
  local_110 = pathStr;
  if (this->disableProximatePaths == false) {
    local_108._M_device = (mutex_type *)((ulong)local_108._M_device & 0xffffffff00000000);
    local_108._8_8_ = std::_V2::system_category();
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::proximate(&local_f8,path,(error_code *)&local_d0);
    std::filesystem::__cxx11::path::~path(&local_d0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_130,&local_f8._M_pathname);
    std::filesystem::__cxx11::path::~path(&local_f8);
    if ((int)local_108._M_device != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_130,0,local_130._M_string_length,(char *)0x0,0);
    }
    if (local_130._M_string_length != 0) goto LAB_00215e04;
  }
  sVar5 = (path->_M_pathname)._M_string_length;
  if (sVar5 == 0) {
LAB_00215dd8:
    std::filesystem::__cxx11::path::path(&local_d0);
  }
  else {
    _Var6._M_head_impl =
         (path->_M_cmpts)._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    uVar14 = (uint)_Var6._M_head_impl;
    __p = path;
    if ((~(byte)_Var6._M_head_impl & 3) != 0) {
      if ((((ulong)_Var6._M_head_impl & 3) == 0) &&
         ((path->_M_pathname)._M_dataplus._M_p[sVar5 - 1] != '/')) {
        if (((ulong)_Var6._M_head_impl & 3) == 0) {
          lVar15 = std::filesystem::__cxx11::path::_List::end();
          __p = (path *)(lVar15 + -0x30);
          if (((ulong)(path->_M_cmpts)._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl & 3) != 0) {
            __p = path;
          }
          uVar14 = (uint)(__p->_M_cmpts)._M_impl._M_t.
                         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                         .
                         super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                         ._M_head_impl;
        }
        if ((~uVar14 & 3) == 0) goto LAB_00215dc9;
      }
      goto LAB_00215dd8;
    }
LAB_00215dc9:
    std::filesystem::__cxx11::path::path(&local_d0,__p);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_130,&local_d0._M_pathname);
  std::filesystem::__cxx11::path::~path(&local_d0);
LAB_00215e04:
  local_108._M_device = &local_148->mutex;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::shared_mutex>::lock(&local_108);
  local_108._M_owns = true;
  std::filesystem::__cxx11::path::parent_path();
  pVar41 = std::
           _Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
           ::_M_insert_unique<std::filesystem::__cxx11::path>
                     (&(local_148->directories)._M_t,&local_d0);
  local_138 = path;
  local_70 = includedFrom;
  local_68 = library;
  local_60 = __return_storage_ptr__;
  std::filesystem::__cxx11::path::~path(&local_d0);
  local_140 = (FileData *)operator_new(0xa8);
  paVar4 = &local_f8._M_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p == paVar3) {
    local_f8._M_pathname.field_2._8_8_ = local_130.field_2._8_8_;
    local_f8._M_pathname._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_f8._M_pathname._M_dataplus._M_p = local_130._M_dataplus._M_p;
  }
  local_f8._M_pathname.field_2._M_allocated_capacity._1_7_ =
       local_130.field_2._M_allocated_capacity._1_7_;
  local_f8._M_pathname.field_2._M_local_buf[0] = local_130.field_2._M_local_buf[0];
  local_f8._M_pathname._M_string_length = local_130._M_string_length;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_130._M_dataplus._M_p = (pointer)paVar3;
  std::filesystem::__cxx11::path::path(&local_d0,local_138);
  FileData::FileData(local_140,(path *)(pVar41.first._M_node._M_node + 1),&local_f8._M_pathname,
                     buffer,&local_d0);
  std::filesystem::__cxx11::path::~path(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_pathname._M_dataplus._M_p != paVar4) {
    operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                    local_f8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  pSVar10 = local_148;
  this_00 = &local_148->lookupCache;
  local_f8._M_pathname.field_2._M_allocated_capacity = std::_V2::system_category();
  psVar11 = local_110;
  local_f8._M_pathname._M_dataplus._M_p = (pointer)local_140;
  local_140 = (FileData *)0x0;
  local_f8._M_pathname._M_string_length = local_f8._M_pathname._M_string_length & 0xffffffff00000000
  ;
  local_138 = (path *)this_00;
  hash = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)this_00,local_110);
  pos0 = hash >> ((byte)(pSVar10->lookupCache).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  pgVar22 = (pSVar10->lookupCache).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
            .arrays.groups_;
  lVar15 = (hash & 0xff) * 4;
  uVar25 = (&UNK_0048f58c)[lVar15];
  uVar26 = (&UNK_0048f58d)[lVar15];
  uVar27 = (&UNK_0048f58e)[lVar15];
  bVar28 = (&UNK_0048f58f)[lVar15];
  ppVar7 = (pSVar10->lookupCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
           .arrays.elements_;
  __s1 = (psVar11->_M_dataplus)._M_p;
  __n = psVar11->_M_string_length;
  uVar16 = (ulong)((uint)hash & 7);
  sVar17 = (pSVar10->lookupCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
           .arrays.groups_size_mask;
  uVar19 = 0;
  uVar23 = pos0;
  uVar29 = uVar25;
  uVar30 = uVar26;
  uVar31 = uVar27;
  bVar32 = bVar28;
  uVar33 = uVar25;
  uVar34 = uVar26;
  uVar35 = uVar27;
  bVar36 = bVar28;
  uVar37 = uVar25;
  uVar38 = uVar26;
  uVar39 = uVar27;
  bVar40 = bVar28;
  do {
    pgVar2 = pgVar22 + uVar23;
    local_48 = pgVar2->m[0].n;
    uStack_47 = pgVar2->m[1].n;
    uStack_46 = pgVar2->m[2].n;
    bStack_45 = pgVar2->m[3].n;
    uStack_44 = pgVar2->m[4].n;
    uStack_43 = pgVar2->m[5].n;
    uStack_42 = pgVar2->m[6].n;
    bStack_41 = pgVar2->m[7].n;
    uStack_40 = pgVar2->m[8].n;
    uStack_3f = pgVar2->m[9].n;
    uStack_3e = pgVar2->m[10].n;
    bStack_3d = pgVar2->m[0xb].n;
    uStack_3c = pgVar2->m[0xc].n;
    uStack_3b = pgVar2->m[0xd].n;
    uStack_3a = pgVar2->m[0xe].n;
    bVar9 = pgVar2->m[0xf].n;
    auVar24[0] = -(local_48 == uVar25);
    auVar24[1] = -(uStack_47 == uVar26);
    auVar24[2] = -(uStack_46 == uVar27);
    auVar24[3] = -(bStack_45 == bVar28);
    auVar24[4] = -(uStack_44 == uVar29);
    auVar24[5] = -(uStack_43 == uVar30);
    auVar24[6] = -(uStack_42 == uVar31);
    auVar24[7] = -(bStack_41 == bVar32);
    auVar24[8] = -(uStack_40 == uVar33);
    auVar24[9] = -(uStack_3f == uVar34);
    auVar24[10] = -(uStack_3e == uVar35);
    auVar24[0xb] = -(bStack_3d == bVar36);
    auVar24[0xc] = -(uStack_3c == uVar37);
    auVar24[0xd] = -(uStack_3b == uVar38);
    auVar24[0xe] = -(uStack_3a == uVar39);
    auVar24[0xf] = -(bVar9 == bVar40);
    uVar14 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
    uVar18 = uVar19;
    bStack_39 = bVar9;
    if (uVar14 != 0) {
      ppVar21 = ppVar7 + uVar23 * 0xf;
      local_a8 = uVar23;
      local_a0 = uVar19;
      local_98 = sVar17;
      do {
        local_90 = (ulong)uVar14;
        uVar8 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        if ((__n == ppVar21[uVar8].first._M_string_length) &&
           ((uVar20 = ppVar21 + uVar8, __n == 0 ||
            (local_88 = ppVar21, local_80 = uVar16, local_78 = pgVar22, local_58 = uVar25,
            uStack_57 = uVar26, uStack_56 = uVar27, bStack_55 = bVar28, uStack_54 = uVar29,
            uStack_53 = uVar30, uStack_52 = uVar31, bStack_51 = bVar32, uStack_50 = uVar33,
            uStack_4f = uVar34, uStack_4e = uVar35, bStack_4d = bVar36, uStack_4c = uVar37,
            uStack_4b = uVar38, uStack_4a = uVar39, bStack_49 = bVar40,
            iVar13 = bcmp(__s1,(((value_type_pointer)uVar20)->first)._M_dataplus._M_p,__n),
            uVar16 = local_80, ppVar21 = local_88, pgVar22 = local_78, uVar25 = local_58,
            uVar26 = uStack_57, uVar27 = uStack_56, bVar28 = bStack_55, uVar29 = uStack_54,
            uVar30 = uStack_53, uVar31 = uStack_52, bVar32 = bStack_51, uVar33 = uStack_50,
            uVar34 = uStack_4f, uVar35 = uStack_4e, bVar36 = bStack_4d, uVar37 = uStack_4c,
            uVar38 = uStack_4b, uVar39 = uStack_4a, bVar40 = bStack_49, iVar13 == 0))))
        goto LAB_0021617a;
        uVar14 = (uint)local_90 - 1 & (uint)local_90;
        sVar17 = local_98;
        uVar18 = local_a0;
        uVar23 = local_a8;
      } while (uVar14 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar16] & bVar9) == 0) break;
    uVar19 = uVar18 + 1;
    uVar23 = uVar23 + uVar18 + 1 & sVar17;
  } while (uVar19 <= sVar17);
  if ((local_148->lookupCache).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
      .size_ctrl.size <
      (local_148->lookupCache).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
      .size_ctrl.ml) {
    in_stack_fffffffffffffe98 = local_110;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>
              ((locator *)&local_d0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
                *)local_138,(arrays_type *)local_138,pos0,hash,&local_149,local_110,
               (pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>
                *)&local_f8);
    psVar1 = &(local_148->lookupCache).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
    uVar20 = local_d0._M_pathname.field_2._M_allocated_capacity;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>
              ((locator *)&local_d0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
                *)local_138,hash,&local_149,local_110,
               (pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>
                *)&local_f8);
    uVar20 = local_d0._M_pathname.field_2._M_allocated_capacity;
  }
LAB_0021617a:
  if ((FileData *)local_f8._M_pathname._M_dataplus._M_p != (FileData *)0x0) {
    std::default_delete<slang::SourceManager::FileData>::operator()
              ((default_delete<slang::SourceManager::FileData> *)&local_f8,
               (FileData *)local_f8._M_pathname._M_dataplus._M_p);
  }
  pSVar12 = local_60;
  createBufferEntry(local_60,local_148,
                    (((value_type_pointer)uVar20)->second).first._M_t.
                    super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                    .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl,
                    local_70,local_68,sortKey,
                    (unique_lock<std::shared_mutex> *)in_stack_fffffffffffffe98);
  if (local_140 != (FileData *)0x0) {
    std::default_delete<slang::SourceManager::FileData>::operator()
              ((default_delete<slang::SourceManager::FileData> *)&local_140,local_140);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
  return pSVar12;
}

Assistant:

SourceBuffer SourceManager::cacheBuffer(fs::path&& path, std::string&& pathStr,
                                        SourceLocation includedFrom, const SourceLibrary* library,
                                        uint64_t sortKey, SmallVector<char>&& buffer) {
    std::string name;
    if (!disableProximatePaths) {
        std::error_code ec;
        name = getU8Str(fs::proximate(path, ec));
        if (ec)
            name = {};
    }

    if (name.empty())
        name = getU8Str(path.filename());

    std::unique_lock<std::shared_mutex> lock(mutex);

    auto directory = &*directories.insert(path.parent_path()).first;
    auto fd = std::make_unique<FileData>(directory, std::move(name), std::move(buffer),
                                         std::move(path));

    // Note: it's possible that insertion here fails due to another thread
    // racing against us to open and insert the same file. We do a lookup
    // in the cache before proceeding to read the file but we drop the lock
    // during the read. It's not actually a problem, we'll just use the data
    // we already loaded (just like we had gotten a hit on the cache in the
    // first place).
    auto [it, inserted] = lookupCache.emplace(pathStr, std::pair{std::move(fd), std::error_code{}});

    FileData* fdPtr = it->second.first.get();
    return createBufferEntry(fdPtr, includedFrom, library, sortKey, lock);
}